

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O3

void __thiscall
cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<std::exception>_>
::~async_result(async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<std::exception>_>
                *this)

{
  _Manager_type p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  std::condition_variable::~condition_variable(&this->cv_);
  p_Var1 = (this->handler_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->handler_,(_Any_data *)&this->handler_,__destroy_functor);
  }
  p_Var2 = (this->err_).super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->result_).super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    return;
  }
  return;
}

Assistant:

~async_result()
    {
    }